

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void ScaleAndAddObjects(Level *Lvl)

{
  long in_RDI;
  int unaff_retaddr;
  Object *O;
  double *local_10;
  
  for (local_10 = *(double **)(in_RDI + 0x100); local_10 != (double *)0x0;
      local_10 = (double *)local_10[10]) {
    local_10[2] = local_10[5] + (double)*(int *)((long)local_10[4] + 0x10);
    local_10[3] = local_10[6] + (double)*(int *)((long)local_10[4] + 0x10);
    *local_10 = local_10[5] - (double)*(int *)((long)local_10[4] + 0x10);
    local_10[1] = local_10[6] - (double)*(int *)((long)local_10[4] + 0x10);
    AddObject(Lvl,O,unaff_retaddr);
    AddObject(Lvl,O,unaff_retaddr);
  }
  return;
}

Assistant:

static void ScaleAndAddObjects(struct Level *Lvl)
{
   struct Object *O = Lvl->AllObjects;
   //double Scaler = (float)screen_height / 480.0f;

   while (O) {
      /* generate bounding box for collisions (i.e. no scaling yet) */
      O->Bounder.BR.Pos[0] = O->Pos[0] + O->ObjType->Radius;
      O->Bounder.BR.Pos[1] = O->Pos[1] + O->ObjType->Radius;
      O->Bounder.TL.Pos[0] = O->Pos[0] - O->ObjType->Radius;
      O->Bounder.TL.Pos[1] = O->Pos[1] - O->ObjType->Radius;

      /* insert into collisions tree */
      AddObject(Lvl, O, false);

      /* scale bounding box to get visual position */
      /*O->Bounder.BR.Pos[0] *= Scaler;
      O->Bounder.BR.Pos[1] *= Scaler;
      O->Bounder.TL.Pos[0] *= Scaler;
      O->Bounder.TL.Pos[1] *= Scaler;*/

      /* insert into display tree */
      AddObject(Lvl, O, true);

      /* move along linked lists */
      O = O->Next;
   }
}